

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O3

token * dmrC_conditional_expression(dmr_C *C,token *token,expression **tree)

{
  expression **ppeVar1;
  expression **tree_00;
  expression *peVar2;
  expression *C_00;
  byte bVar7;
  token *ptVar3;
  expression *peVar4;
  char *pcVar5;
  expression *peVar6;
  position pVar8;
  expression *local_50;
  expression **local_48;
  expression *local_40;
  expression *right;
  
  local_50 = (expression *)0x0;
  right = (expression *)C;
  ptVar3 = logical_and_expression(C,token,&local_50);
  if (local_50 == (expression *)0x0) {
    *tree = (expression *)0x0;
  }
  else {
    pVar8 = ptVar3->pos;
    peVar4 = local_50;
    local_48 = tree;
    if ((pVar8._0_4_ & 0x3f) == 0x11) {
      peVar2 = right + 7;
      peVar6 = local_50;
      do {
        local_40 = (expression *)0x0;
        peVar4 = peVar6;
        if ((ptVar3->field_2).special != 0x10e) break;
        peVar4 = (expression *)
                 dmrC_allocator_allocate((allocator *)((long)&peVar2->field_5 + 0x10),0);
        *(undefined1 *)peVar4 = 7;
        peVar4->pos = pVar8;
        ptVar3 = logical_and_expression((dmr_C *)right,ptVar3->next,&local_40);
        C_00 = right;
        if (local_40 == (expression *)0x0) {
          pcVar5 = dmrC_show_special((dmr_C *)right,0x10e);
          dmrC_sparse_error((dmr_C *)C_00,ptVar3->pos,"No right hand side of \'%s\'-expression",
                            pcVar5);
          peVar4 = peVar6;
          break;
        }
        peVar4->field_0x1 =
             (byte)((ushort)*(undefined2 *)peVar6 >> 8) &
             (byte)((ushort)*(undefined2 *)local_40 >> 8) & 1;
        peVar4->op = 0x10e;
        (peVar4->field_5).field_3.unop = peVar6;
        (peVar4->field_5).field_2.string = (string *)local_40;
        pVar8 = ptVar3->pos;
        peVar6 = peVar4;
      } while ((pVar8._0_4_ & 0x3f) == 0x11);
    }
    peVar2 = right;
    ppeVar1 = local_48;
    *local_48 = peVar4;
    pVar8 = ptVar3->pos;
    if (((pVar8._0_4_ & 0x3f) == 0x11) && ((ptVar3->field_2).special == 0x3f)) {
      peVar6 = (expression *)
               dmrC_allocator_allocate((allocator *)((long)&right[7].field_5 + 0x10),0);
      *(undefined1 *)peVar6 = 0x11;
      peVar6->pos = pVar8;
      peVar6->op = (ptVar3->field_2).special;
      (peVar6->field_5).expr_list = (expression_list *)*ppeVar1;
      *ppeVar1 = peVar6;
      ppeVar1 = &(peVar6->field_5).field_6.right;
      ptVar3 = comma_expression((dmr_C *)peVar2,ptVar3->next,ppeVar1);
      ptVar3 = dmrC_expect_token((dmr_C *)peVar2,ptVar3,0x3a,"in conditional expression");
      tree_00 = &(peVar6->field_5).field_10.cond_false;
      ptVar3 = dmrC_conditional_expression((dmr_C *)peVar2,ptVar3,tree_00);
      peVar4 = (peVar6->field_5).field_3.unop;
      if ((peVar4 != (expression *)0x0) && (peVar2 = *tree_00, peVar2 != (expression *)0x0)) {
        bVar7 = (byte)((ushort)*(undefined2 *)peVar2 >> 8) &
                (byte)((ushort)*(undefined2 *)peVar4 >> 8);
        peVar4 = *ppeVar1;
        if (peVar4 != (expression *)0x0) {
          bVar7 = bVar7 & (byte)((ushort)*(undefined2 *)peVar4 >> 8);
        }
        peVar6->field_0x1 = bVar7 & 1;
      }
    }
  }
  return ptVar3;
}

Assistant:

struct token *dmrC_conditional_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	token = logical_or_expression(C, token, tree);
	if (*tree && dmrC_match_op(token, '?')) {
		struct expression *expr = dmrC_alloc_expression(C, token->pos, EXPR_CONDITIONAL);
		expr->op = token->special;
		expr->left = *tree;
		*tree = expr;
		token = dmrC_parse_expression(C, token->next, &expr->cond_true);
		token = dmrC_expect_token(C, token, ':', "in conditional expression");
		token = dmrC_conditional_expression(C, token, &expr->cond_false);
		if (expr->left && expr->cond_false) {
			int is_const = expr->left->flags &
					expr->cond_false->flags &
					Int_const_expr;
			if (expr->cond_true)
				is_const &= expr->cond_true->flags;
			expr->flags = is_const;
		}
	}
	return token;
}